

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

double anon_unknown.dwarf_3cb434::standard_deviation(iterator first,iterator last)

{
  iterator iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = Catch::Benchmark::Detail::
          mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     first._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     last._M_current);
  dVar3 = 0.0;
  for (iVar1._M_current = first._M_current; iVar1._M_current != last._M_current;
      iVar1._M_current = iVar1._M_current + 1) {
    dVar3 = dVar3 + (*iVar1._M_current - dVar2) * (*iVar1._M_current - dVar2);
  }
  dVar3 = dVar3 / (double)((long)last._M_current - (long)first._M_current >> 3);
  if (0.0 <= dVar3) {
    return SQRT(dVar3);
  }
  dVar2 = sqrt(dVar3);
  return dVar2;
}

Assistant:

double standard_deviation(std::vector<double>::iterator first, std::vector<double>::iterator last) {
        auto m = Catch::Benchmark::Detail::mean(first, last);
        double variance = std::accumulate(first, last, 0., [m](double a, double b) {
            double diff = b - m;
            return a + diff * diff;
            }) / (last - first);
            return std::sqrt(variance);
    }